

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::copy_sub_create_info<VkPipelineRasterizationStateCreateInfo>
          (Impl *this,VkPipelineRasterizationStateCreateInfo **sub_info,ScratchAllocator *alloc,
          DynamicStateInfo *dynamic_state_info,VkGraphicsPipelineLibraryFlagsEXT state_flags)

{
  VkPipelineRasterizationStateCreateInfo *pVVar1;
  void *pvVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  VkCullModeFlags VVar6;
  VkFrontFace VVar7;
  VkBool32 VVar8;
  float fVar9;
  VkPipelineRasterizationStateCreateFlags VVar10;
  VkBool32 VVar11;
  VkBool32 VVar12;
  VkPolygonMode VVar13;
  VkStructureType VVar14;
  undefined4 uVar15;
  bool bVar16;
  VkPipelineRasterizationStateCreateInfo *pVVar17;
  bool bVar18;
  void *pNext;
  void *local_38;
  
  pVVar1 = *sub_info;
  bVar18 = true;
  if (pVVar1 != (VkPipelineRasterizationStateCreateInfo *)0x0) {
    pVVar17 = (VkPipelineRasterizationStateCreateInfo *)
              ScratchAllocator::allocate_raw(alloc,0x40,0x10);
    if (pVVar17 != (VkPipelineRasterizationStateCreateInfo *)0x0) {
      VVar14 = pVVar1->sType;
      uVar15 = *(undefined4 *)&pVVar1->field_0x4;
      pvVar2 = pVVar1->pNext;
      VVar10 = pVVar1->flags;
      VVar11 = pVVar1->depthClampEnable;
      VVar12 = pVVar1->rasterizerDiscardEnable;
      VVar13 = pVVar1->polygonMode;
      VVar6 = pVVar1->cullMode;
      VVar7 = pVVar1->frontFace;
      VVar8 = pVVar1->depthBiasEnable;
      fVar9 = pVVar1->depthBiasConstantFactor;
      fVar3 = pVVar1->depthBiasSlopeFactor;
      fVar4 = pVVar1->lineWidth;
      uVar5 = *(undefined4 *)&pVVar1->field_0x3c;
      pVVar17->depthBiasClamp = pVVar1->depthBiasClamp;
      pVVar17->depthBiasSlopeFactor = fVar3;
      pVVar17->lineWidth = fVar4;
      *(undefined4 *)&pVVar17->field_0x3c = uVar5;
      pVVar17->cullMode = VVar6;
      pVVar17->frontFace = VVar7;
      pVVar17->depthBiasEnable = VVar8;
      pVVar17->depthBiasConstantFactor = fVar9;
      pVVar17->flags = VVar10;
      pVVar17->depthClampEnable = VVar11;
      pVVar17->rasterizerDiscardEnable = VVar12;
      pVVar17->polygonMode = VVar13;
      pVVar17->sType = VVar14;
      *(undefined4 *)&pVVar17->field_0x4 = uVar15;
      pVVar17->pNext = pvVar2;
    }
    *sub_info = pVVar17;
    local_38 = (void *)0x0;
    bVar16 = copy_pnext_chain(this,pVVar17->pNext,alloc,&local_38,dynamic_state_info,state_flags);
    if (bVar16) {
      (*sub_info)->pNext = local_38;
    }
    else {
      bVar18 = false;
    }
  }
  return bVar18;
}

Assistant:

bool StateRecorder::Impl::copy_sub_create_info(const SubCreateInfo *&sub_info, ScratchAllocator &alloc,
                                               const DynamicStateInfo *dynamic_state_info,
                                               VkGraphicsPipelineLibraryFlagsEXT state_flags)
{
	if (sub_info)
	{
		sub_info = copy(sub_info, 1, alloc);
		const void *pNext = nullptr;
		if (!copy_pnext_chain(sub_info->pNext, alloc, &pNext, dynamic_state_info, state_flags))
			return false;
		const_cast<SubCreateInfo *>(sub_info)->pNext = pNext;
	}

	return true;
}